

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDAHandleFailure(IDAMem IDA_mem,int sflag)

{
  int in_ESI;
  IDAMem in_RDI;
  int local_4;
  
  if (in_ESI == -9999) {
    IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI,-0x14,(char *)0x95e,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"At t = %.15g, the nonlinear solver was passed a NULL input.");
    local_4 = -0x14;
  }
  else if (in_ESI == -0x14) {
    IDAProcessError((IDAMem)0x0,-0x14,0x95a,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_ESI == -0x11) {
    IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI,-0x11,(char *)0x967,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"At t = %.15g, the nonlinear solver failed in an unrecoverable manner.");
    local_4 = -0x11;
  }
  else if (in_ESI == -0x10) {
    IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI,-0x10,(char *)0x963,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"At t = %.15g, the nonlinear solver setup failed unrecoverably.");
    local_4 = -0x10;
  }
  else if (in_ESI == -0xb) {
    IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI,-0xb,(char *)0x955,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"At t = %.15gunable to satisfy inequality constraints.");
    local_4 = -0xb;
  }
  else if (in_ESI == -9) {
    IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI,-9,(char *)0x94b,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"At t = %.15grepeated recoverable residual errors.");
    local_4 = -9;
  }
  else if (in_ESI == -8) {
    IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI,-8,(char *)0x950,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"At t = %.15gthe residual function failed unrecoverably.");
    local_4 = -8;
  }
  else if (in_ESI == -7) {
    IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI,-7,(char *)0x946,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"At t = %.15gthe linear solver solve failed unrecoverably.");
    local_4 = -7;
  }
  else if (in_ESI == -6) {
    IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI,-6,(char *)0x941,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"At t = %.15gthe linear solver setup failed unrecoverably.");
    local_4 = -6;
  }
  else if (in_ESI == -4) {
    IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI->ida_hh,(int)in_RDI,(char *)0xfffffffc,
                    (char *)0x93c,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,
                    "At t = %.15g and h = %.15gthe corrector convergence failed repeatedly or with |h| = hmin."
                   );
    local_4 = -4;
  }
  else if (in_ESI == -3) {
    IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI->ida_hh,(int)in_RDI,(char *)0xfffffffd,
                    (char *)0x937,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,
                    "At t = %.15g and h = %.15gthe error test failed repeatedly or with |h| = hmin."
                   );
    local_4 = -3;
  }
  else {
    IDAProcessError(in_RDI,-99,0x96d,"IDAHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,
                    "IDA encountered an unrecognized error. Please report this to the Sundials developers at sundials-users@llnl.gov"
                   );
    local_4 = -99;
  }
  return local_4;
}

Assistant:

static int IDAHandleFailure(IDAMem IDA_mem, int sflag)
{
  /* Depending on sflag, print error message and return error flag */
  switch (sflag)
  {
  case IDA_ERR_FAIL:
    IDAProcessError(IDA_mem, IDA_ERR_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ERR_FAILS, IDA_mem->ida_tn, IDA_mem->ida_hh);
    return (IDA_ERR_FAIL);

  case IDA_CONV_FAIL:
    IDAProcessError(IDA_mem, IDA_CONV_FAIL, __LINE__, __func__, __FILE__,
                    MSG_CONV_FAILS, IDA_mem->ida_tn, IDA_mem->ida_hh);
    return (IDA_CONV_FAIL);

  case IDA_LSETUP_FAIL:
    IDAProcessError(IDA_mem, IDA_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SETUP_FAILED, IDA_mem->ida_tn);
    return (IDA_LSETUP_FAIL);

  case IDA_LSOLVE_FAIL:
    IDAProcessError(IDA_mem, IDA_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SOLVE_FAILED, IDA_mem->ida_tn);
    return (IDA_LSOLVE_FAIL);

  case IDA_REP_RES_ERR:
    IDAProcessError(IDA_mem, IDA_REP_RES_ERR, __LINE__, __func__, __FILE__,
                    MSG_REP_RES_ERR, IDA_mem->ida_tn);
    return (IDA_REP_RES_ERR);

  case IDA_RES_FAIL:
    IDAProcessError(IDA_mem, IDA_RES_FAIL, __LINE__, __func__, __FILE__,
                    MSG_RES_NONRECOV, IDA_mem->ida_tn);
    return (IDA_RES_FAIL);

  case IDA_CONSTR_FAIL:
    IDAProcessError(IDA_mem, IDA_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                    MSG_FAILED_CONSTR, IDA_mem->ida_tn);
    return (IDA_CONSTR_FAIL);

  case IDA_MEM_NULL:
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);

  case SUN_ERR_ARG_CORRUPT:
    IDAProcessError(IDA_mem, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_NLS_INPUT_NULL, IDA_mem->ida_tn);
    return (IDA_MEM_NULL);

  case IDA_NLS_SETUP_FAIL:
    IDAProcessError(IDA_mem, IDA_NLS_SETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_NLS_SETUP_FAILED, IDA_mem->ida_tn);
    return (IDA_NLS_SETUP_FAIL);
  case IDA_NLS_FAIL:
    IDAProcessError(IDA_mem, IDA_NLS_FAIL, __LINE__, __func__, __FILE__,
                    MSG_NLS_FAIL, IDA_mem->ida_tn);
    return (IDA_NLS_FAIL);
  }

  /* This return should never happen */
  IDAProcessError(IDA_mem, IDA_UNRECOGNIZED_ERROR, __LINE__, __func__, __FILE__,
                  "IDA encountered an unrecognized error. Please report this "
                  "to the Sundials developers at sundials-users@llnl.gov");
  return (IDA_UNRECOGNIZED_ERROR);
}